

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

_Bool tcache_bin_info_settings_parse
                (char *bin_settings_segment_cur,size_t len_left,
                cache_bin_info_t *duckdb_je_tcache_bin_info,_Bool *bin_info_is_set)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  _Bool _Var4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  size_t ncached_max;
  size_t size_end;
  size_t size_start;
  size_t local_60;
  char *local_58;
  uint local_4c;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  local_48 = len_left;
  local_38 = bin_settings_segment_cur;
  do {
    _Var4 = duckdb_je_multi_setting_parse_next
                      (&local_38,&local_48,(size_t *)&local_40,(size_t *)&local_58,&local_60);
    if (_Var4) {
      return _Var4;
    }
    if ("ZN6duckdb17AggregateFunction12BinaryUpdateINS_14ArgMinMaxStateIiiEEiiNS_13ArgMinMaxBaseINS_11GreaterThanELb1EEEEEvPNS_6VectorERNS_18AggregateInputDataEmPhm"
        < local_58) {
      local_58 = 
      "ZN6duckdb17AggregateFunction12BinaryUpdateINS_14ArgMinMaxStateIiiEEiiNS_13ArgMinMaxBaseINS_11GreaterThanELb1EEEEEvPNS_6VectorERNS_18AggregateInputDataEmPhm"
      ;
    }
    pcVar3 = local_58;
    if (local_40 <= local_58 &&
        local_40 <
        "N6duckdb17AggregateFunction12BinaryUpdateINS_14ArgMinMaxStateIiiEEiiNS_13ArgMinMaxBaseINS_11GreaterThanELb1EEEEEvPNS_6VectorERNS_18AggregateInputDataEmPhm"
       ) {
      uVar9 = 0;
      if (local_40 != (char *)0x0) {
        tcache_bin_info_settings_parse_cold_1();
        uVar9 = (ulong)local_4c;
      }
      if (pcVar3 < (char *)0x7000000000000001) {
        if (pcVar3 == (char *)0x0) {
          uVar8 = 0;
        }
        else if (pcVar3 < (char *)0x9) {
          lVar2 = 0x3f;
          if (pcVar3 + -1 != (char *)0x0) {
            for (; (ulong)(pcVar3 + -1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar7 = ((uint)lVar2 ^ 0x3f) - 1 ^ 0x3f;
          uVar8 = uVar7 - 3;
          if (uVar7 < 3) {
            uVar8 = 0;
          }
          if (pcVar3 == (char *)0x1) {
            uVar8 = 0;
          }
        }
        else {
          uVar1 = (long)pcVar3 * 2 - 1;
          lVar2 = 0x3f;
          if (uVar1 != 0) {
            for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar8 = (uint)lVar2;
          iVar5 = uVar8 - 6;
          if (uVar8 < 6) {
            iVar5 = 0;
          }
          bVar6 = 0x3c - ((byte)lVar2 ^ 0x3f);
          if (uVar8 < 7) {
            bVar6 = 4;
          }
          uVar8 = ((uint)((((ulong)(pcVar3 + -1) >> (bVar6 & 0x3f)) << (bVar6 & 0x3f)) >>
                         (bVar6 & 0x3f)) & 3) + iVar5 * 4 + 1;
        }
      }
      else {
        uVar8 = 0xe8;
      }
      if (0x1fff < local_60) {
        local_60 = 0x1fff;
      }
      for (; (uint)uVar9 <= uVar8; uVar9 = (ulong)((uint)uVar9 + 1)) {
        duckdb_je_cache_bin_info_init(duckdb_je_tcache_bin_info + uVar9,(cache_bin_sz_t)local_60);
        if (bin_info_is_set != (_Bool *)0x0) {
          bin_info_is_set[uVar9] = true;
        }
      }
    }
  } while (local_48 != 0 && !_Var4);
  return _Var4;
}

Assistant:

static bool
tcache_bin_info_settings_parse(const char *bin_settings_segment_cur,
    size_t len_left, cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX],
    bool bin_info_is_set[TCACHE_NBINS_MAX]) {
	do {
		size_t size_start, size_end;
		size_t ncached_max;
		bool err = multi_setting_parse_next(&bin_settings_segment_cur,
		    &len_left, &size_start, &size_end, &ncached_max);
		if (err) {
			return true;
		}
		if (size_end > TCACHE_MAXCLASS_LIMIT) {
			size_end = TCACHE_MAXCLASS_LIMIT;
		}
		if (size_start > TCACHE_MAXCLASS_LIMIT ||
		    size_start > size_end) {
			continue;
		}
		/* May get called before sz_init (during malloc_conf_init). */
		szind_t bin_start = sz_size2index_compute(size_start);
		szind_t bin_end = sz_size2index_compute(size_end);
		if (ncached_max > CACHE_BIN_NCACHED_MAX) {
			ncached_max = (size_t)CACHE_BIN_NCACHED_MAX;
		}
		for (szind_t i = bin_start; i <= bin_end; i++) {
			cache_bin_info_init(&tcache_bin_info[i],
			    (cache_bin_sz_t)ncached_max);
			if (bin_info_is_set != NULL) {
				bin_info_is_set[i] = true;
			}
		}
	} while (len_left > 0);

	return false;
}